

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

void ogt_vox_test(void)

{
  uint32_t uVar1;
  char *test_message;
  
  uVar1 = compute_looped_frame_index(0,0,0);
  if (uVar1 != 0) {
    __assert_fail("(compute_looped_frame_index( 0, 0, 0 ) == 0) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc5b,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,0,1);
  if (uVar1 != 0) {
    __assert_fail("(compute_looped_frame_index( 0, 0, 1 ) == 0) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc5c,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,0,0xf);
  if (uVar1 != 0) {
    __assert_fail("(compute_looped_frame_index( 0, 0, 15) == 0) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc5d,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(1,1,0);
  if (uVar1 != 1) {
    __assert_fail("(compute_looped_frame_index( 1, 1, 0) == 1) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc5f,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(1,1,1);
  if (uVar1 != 1) {
    __assert_fail("(compute_looped_frame_index( 1, 1, 1) == 1) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc60,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(1,1,0xf);
  if (uVar1 != 1) {
    __assert_fail("(compute_looped_frame_index( 1, 1, 15) == 1) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc61,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,0);
  if (uVar1 != 0) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 0) == 0) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc63,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,4);
  if (uVar1 != 4) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 4) == 4) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc64,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,9);
  if (uVar1 != 9) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 9) == 9) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc65,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,10);
  if (uVar1 != 0) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 10) == 0) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc66,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,0xb);
  if (uVar1 != 1) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 11) == 1) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc67,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,0xe);
  if (uVar1 != 4) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 14) == 4) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc68,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,0x13);
  if (uVar1 != 9) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 19) == 9) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc69,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(0,9,0x15);
  if (uVar1 != 1) {
    __assert_fail("(compute_looped_frame_index( 0, 9, 21) == 1) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc6a,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,0);
  if (uVar1 != 10) {
    __assert_fail("(compute_looped_frame_index(4, 13, 0 ) == 10) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc6c,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,3);
  if (uVar1 != 0xd) {
    __assert_fail("(compute_looped_frame_index(4, 13, 3 ) == 13) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc6d,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,4);
  if (uVar1 != 4) {
    __assert_fail("(compute_looped_frame_index(4, 13, 4 ) == 4) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc6e,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,5);
  if (uVar1 != 5) {
    __assert_fail("(compute_looped_frame_index(4, 13, 5 ) == 5) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc6f,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,0xc);
  if (uVar1 != 0xc) {
    __assert_fail("(compute_looped_frame_index(4, 13, 12) == 12) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc70,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,0xd);
  if (uVar1 != 0xd) {
    __assert_fail("(compute_looped_frame_index(4, 13, 13) == 13) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc71,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,0xe);
  if (uVar1 != 4) {
    __assert_fail("(compute_looped_frame_index(4, 13, 14) == 4) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc72,"void ogt_vox_test()");
  }
  uVar1 = compute_looped_frame_index(4,0xd,0x15);
  if (uVar1 != 0xb) {
    __assert_fail("(compute_looped_frame_index(4, 13, 21) == 11) && (test_message)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc73,"void ogt_vox_test()");
  }
  return;
}

Assistant:

void ogt_vox_test()
    {
        // frame_index looping tests
        {
            const char* test_message = "failed compute_looped_frame_index test";
            (void)test_message;
            // [0,0] = 1 keyframe animation starting at frame 0
            ogt_assert(compute_looped_frame_index( 0,  0, 0 ) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  0, 1 ) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  0, 15) == 0, test_message);
            // [1,1] = 1 keyframe animation starting at frame 1
            ogt_assert(compute_looped_frame_index( 1,  1,  0) == 1, test_message);
            ogt_assert(compute_looped_frame_index( 1,  1,  1) == 1, test_message);
            ogt_assert(compute_looped_frame_index( 1,  1, 15) == 1, test_message);
            // [0,9] = 10 keyframe animation starting at frame 0
            ogt_assert(compute_looped_frame_index( 0,  9,  0) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9,  4) == 4, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9,  9) == 9, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 10) == 0, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 11) == 1, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 14) == 4, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 19) == 9, test_message);
            ogt_assert(compute_looped_frame_index( 0,  9, 21) == 1, test_message);
            // [4,13] = 10 keyframe animation starting at frame 4
            ogt_assert(compute_looped_frame_index(4, 13, 0 ) == 10, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 3 ) == 13, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 4 ) == 4,  test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 5 ) == 5,  test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 12) == 12, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 13) == 13, test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 14) == 4,  test_message);
            ogt_assert(compute_looped_frame_index(4, 13, 21) == 11, test_message);
        }

    }